

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-create.c
# Opt level: O3

cn_cbor * cn_cbor_string_create(char *data,cn_cbor_errback *errp)

{
  cn_cbor *pcVar1;
  size_t sVar2;
  
  if (errp == (cn_cbor_errback *)0x0) {
    pcVar1 = (cn_cbor *)calloc(1,0x38);
    if (pcVar1 != (cn_cbor *)0x0) goto LAB_00193d0e;
  }
  else {
    errp->err = CN_CBOR_NO_ERROR;
    pcVar1 = (cn_cbor *)calloc(1,0x38);
    if (pcVar1 != (cn_cbor *)0x0) {
LAB_00193d0e:
      pcVar1->type = CN_CBOR_TEXT;
      sVar2 = strlen(data);
      pcVar1->length = (int)sVar2;
      (pcVar1->v).str = data;
      return pcVar1;
    }
    errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
  }
  return (cn_cbor *)0x0;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_string_create(const char* data
                               CBOR_CONTEXT,
                               cn_cbor_errback *errp)
{
  cn_cbor* ret;
  INIT_CB(ret);

  ret->type = CN_CBOR_TEXT;
  ret->length = strlen(data);
  ret->v.str = data;

  return ret;
}